

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O2

qint64 __thiscall QRingBuffer::indexOf(QRingBuffer *this,char c,qint64 maxLength,qint64 pos)

{
  QRingChunk *pQVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  void *pvVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  QRingChunk *pQVar9;
  long lVar10;
  qint64 qVar11;
  
  if (maxLength != 0) {
    pQVar1 = (this->buffers).d.ptr;
    lVar2 = (this->buffers).d.size;
    lVar4 = -pos;
    pQVar9 = pQVar1;
    for (lVar7 = 0; lVar2 * 0x28 != lVar7; lVar7 = lVar7 + 0x28) {
      lVar3 = pQVar9->headOffset;
      lVar10 = (pQVar9->tailOffset - lVar3) + lVar4;
      qVar11 = maxLength;
      if (lVar10 < maxLength) {
        qVar11 = lVar10;
      }
      if (0 < qVar11) {
        pcVar6 = *(char **)((long)&(pQVar1->chunk).d.ptr + lVar7);
        if (pcVar6 == (char *)0x0) {
          pcVar6 = "";
        }
        lVar8 = 0;
        if (0 < lVar4) {
          lVar8 = lVar4;
        }
        pvVar5 = memchr(pcVar6 + lVar3 + (lVar4 >> 0x3f & -lVar4),(int)c,qVar11 - lVar8);
        if (pvVar5 != (void *)0x0) {
          return (long)pvVar5 + ((lVar8 + pos) - (long)(pcVar6 + lVar3 + (lVar4 >> 0x3f & -lVar4)));
        }
        if (maxLength <= lVar10) {
          return -1;
        }
      }
      pQVar9 = pQVar9 + 1;
      lVar4 = qVar11;
    }
  }
  return -1;
}

Assistant:

qint64 QRingBuffer::indexOf(char c, qint64 maxLength, qint64 pos) const
{
    Q_ASSERT(maxLength >= 0 && pos >= 0);

    if (maxLength == 0)
        return -1;

    qint64 index = -pos;
    for (const QRingChunk &chunk : buffers) {
        const qint64 nextBlockIndex = qMin(index + chunk.size(), maxLength);

        if (nextBlockIndex > 0) {
            const char *ptr = chunk.data();
            if (index < 0) {
                ptr -= index;
                index = 0;
            }

            const char *findPtr = reinterpret_cast<const char *>(memchr(ptr, c,
                                                                        nextBlockIndex - index));
            if (findPtr)
                return qint64(findPtr - ptr) + index + pos;

            if (nextBlockIndex == maxLength)
                return -1;
        }
        index = nextBlockIndex;
    }
    return -1;
}